

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workqueue.h
# Opt level: O2

void __thiscall rengine::WorkQueue::WorkQueue(WorkQueue *this)

{
  code *local_28;
  undefined8 local_20;
  WorkQueue *local_18;
  
  local_28 = run;
  local_20 = 0;
  local_18 = this;
  std::thread::thread<void(rengine::WorkQueue::*)(),rengine::WorkQueue*,void>
            (&this->m_thread,(type *)&local_28,&local_18);
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->m_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex).super___mutex_base._M_mutex + 8) = 0;
  (this->m_mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->m_condition);
  (this->m_jobs).
  super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_jobs;
  (this->m_jobs).
  super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_jobs;
  (this->m_jobs).
  super__List_base<std::shared_ptr<rengine::WorkQueue::Job>,_std::allocator<std::shared_ptr<rengine::WorkQueue::Job>_>_>
  ._M_impl._M_node._M_size = 0;
  this->m_running = true;
  return;
}

Assistant:

inline WorkQueue::WorkQueue()
    : m_thread(&WorkQueue::run, this)
{
}